

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

Float pbrt::SpectrumToPhotometric(Spectrum *s)

{
  bool bVar1;
  RGBIlluminantSpectrum *this;
  DenselySampledSpectrum *in_RDI;
  Float FVar2;
  Spectrum *unaff_retaddr;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  *in_stack_ffffffffffffffe0;
  DenselySampledSpectrum *g;
  
  g = in_RDI;
  bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          ::Is<pbrt::RGBIlluminantSpectrum>(in_stack_ffffffffffffffe0);
  if (bVar1) {
    this = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           ::Cast<pbrt::RGBIlluminantSpectrum>(in_stack_ffffffffffffffe0);
    RGBIlluminantSpectrum::Illuminant(this);
    Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              ((Spectrum *)in_stack_ffffffffffffffe0,in_RDI);
    Spectrum::operator=((Spectrum *)in_stack_ffffffffffffffe0,(Spectrum *)in_RDI);
  }
  Spectra::Y();
  Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((Spectrum *)in_stack_ffffffffffffffe0,in_RDI);
  Spectrum::Spectrum((Spectrum *)in_stack_ffffffffffffffe0,(Spectrum *)in_RDI);
  FVar2 = InnerProduct(unaff_retaddr,(Spectrum *)g);
  return FVar2;
}

Assistant:

Float SpectrumToPhotometric(Spectrum s) {
    // We have to handle RGBIlluminantSpectrum separately here as it's composed of an
    // illuminant spectrum and an RGB multiplier. We only want to consider the
    // illuminant for the sake of this calculation, and we should consider the
    // RGB separately for the purposes of target power/illuminance computation
    // in the lights themselves (but we currently don't)
    if (s.Is<RGBIlluminantSpectrum>())
        s = s.Cast<RGBIlluminantSpectrum>()->Illuminant();

    return InnerProduct(&Spectra::Y(), s);
}